

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaLib.cpp
# Opt level: O0

bool xmrig::CudaLib::load(void)

{
  int iVar1;
  runtime_error *prVar2;
  exception *ex;
  bool local_1;
  
  iVar1 = uv_dlsym(cudaLib,kVersion,&pVersion);
  if (iVar1 == -1) {
    local_1 = false;
  }
  else {
    iVar1 = (*pVersion)(0);
    if (iVar1 == 2) {
      iVar1 = uv_dlsym(cudaLib,kAlloc,&pAlloc);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kCnHash,&pCnHash);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kDeviceCount,&pDeviceCount);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kDeviceInfo,&pDeviceInfo);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kDeviceInit,&pDeviceInit);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kDeviceInt,&pDeviceInt);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kDeviceName,&pDeviceName);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kDeviceUint,&pDeviceUint);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kDeviceUlong,&pDeviceUlong);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kInit,&pInit);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kLastError,&pLastError);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kPluginVersion,&pPluginVersion);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kRelease,&pRelease);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kSetJob,&pSetJob);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = uv_dlsym(cudaLib,kVersion,&pVersion);
      if (iVar1 == -1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      (*pInit)();
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool xmrig::CudaLib::load()
{
    if (uv_dlsym(&cudaLib, kVersion, reinterpret_cast<void**>(&pVersion)) == -1) {
        return false;
    }

    if (pVersion(ApiVersion) != 2u) {
        return false;
    }

    try {
        DLSYM(Alloc);
        DLSYM(CnHash);
        DLSYM(DeviceCount);
        DLSYM(DeviceInfo);
        DLSYM(DeviceInit);
        DLSYM(DeviceInt);
        DLSYM(DeviceName);
        DLSYM(DeviceUint);
        DLSYM(DeviceUlong);
        DLSYM(Init);
        DLSYM(LastError);
        DLSYM(PluginVersion);
        DLSYM(Release);
        DLSYM(SetJob);
        DLSYM(Version);
    } catch (std::exception &ex) {
        return false;
    }

    pInit();

    return true;
}